

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O2

void av1_iadst8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  undefined7 in_register_00000011;
  long lVar13;
  long lVar14;
  int32_t step [8];
  
  lVar14 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = input[7];
  output[1] = *input;
  output[2] = input[5];
  output[3] = input[2];
  output[4] = input[3];
  output[5] = input[4];
  output[6] = input[1];
  output[7] = input[6];
  av1_range_check_buf(1,input,output,8,stage_range[1]);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x250);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x170);
  lVar13 = 1L << (cos_bit - 1U & 0x3f);
  step[0] = (int32_t)(*output * iVar2 + lVar13 + (long)(output[1] * iVar1) >> (cos_bit & 0x3fU));
  step[1] = (int32_t)(iVar1 * *output + lVar13 + (long)-(iVar2 * output[1]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1b0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x210);
  step[2] = (int32_t)(output[2] * iVar1 + lVar13 + (long)(output[3] * iVar2) >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(iVar2 * output[2] + lVar13 + (long)-(iVar1 * output[3]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1f0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1d0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar14 + 400);
  step[4] = (int32_t)(output[4] * iVar1 + lVar13 + (long)(output[5] * iVar2) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar2 * output[4] + lVar13 + (long)-(iVar1 * output[5]) >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x230);
  step[6] = (int32_t)(output[6] * iVar1 + lVar13 + (long)(output[7] * iVar3) >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(iVar3 * output[6] + lVar13 + (long)-(iVar1 * output[7]) >> (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,step,8,stage_range[2]);
  iVar12 = step[4];
  iVar10 = step[0];
  iVar7 = clamp_value(step[4] + step[0],stage_range[3]);
  iVar4 = step[5];
  iVar11 = step[1];
  *output = iVar7;
  iVar8 = clamp_value(step[5] + step[1],stage_range[3]);
  iVar5 = step[6];
  iVar7 = step[2];
  output[1] = iVar8;
  iVar9 = clamp_value(step[6] + step[2],stage_range[3]);
  iVar6 = step[7];
  iVar8 = step[3];
  output[2] = iVar9;
  iVar9 = clamp_value(step[7] + step[3],stage_range[3]);
  output[3] = iVar9;
  iVar10 = clamp_value(iVar10 - iVar12,stage_range[3]);
  output[4] = iVar10;
  iVar10 = clamp_value(iVar11 - iVar4,stage_range[3]);
  output[5] = iVar10;
  iVar10 = clamp_value(iVar7 - iVar5,stage_range[3]);
  output[6] = iVar10;
  iVar10 = clamp_value(iVar8 - iVar6,stage_range[3]);
  output[7] = iVar10;
  av1_range_check_buf(3,input,output,8,stage_range[3]);
  step._0_8_ = *(undefined8 *)output;
  step._8_8_ = *(undefined8 *)(output + 2);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1a0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x220);
  step[4] = (int32_t)(output[4] * iVar1 + lVar13 + (long)(output[5] * iVar2) >> (cos_bit & 0x3fU));
  step[5] = (int32_t)(iVar2 * output[4] + lVar13 + (long)-(iVar1 * output[5]) >> (cos_bit & 0x3fU));
  step[6] = (int32_t)(output[7] * iVar1 + lVar13 + (long)-(iVar2 * output[6]) >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(output[6] * iVar1 + lVar13 + (long)(output[7] * iVar2) >> (cos_bit & 0x3fU));
  av1_range_check_buf(4,input,step,8,stage_range[4]);
  iVar10 = step[0];
  iVar7 = step[2];
  iVar11 = clamp_value(step[2] + step[0],stage_range[5]);
  *output = iVar11;
  iVar11 = step[1];
  iVar8 = step[3];
  iVar12 = clamp_value(step[1] + step[3],stage_range[5]);
  output[1] = iVar12;
  iVar10 = clamp_value(iVar10 - iVar7,stage_range[5]);
  output[2] = iVar10;
  iVar11 = clamp_value(iVar11 - iVar8,stage_range[5]);
  iVar7 = step[6];
  iVar10 = step[4];
  output[3] = iVar11;
  iVar12 = clamp_value(step[6] + step[4],stage_range[5]);
  iVar8 = step[7];
  iVar11 = step[5];
  output[4] = iVar12;
  iVar12 = clamp_value(step[5] + step[7],stage_range[5]);
  output[5] = iVar12;
  iVar10 = clamp_value(iVar10 - iVar7,stage_range[5]);
  output[6] = iVar10;
  iVar10 = clamp_value(iVar11 - iVar8,stage_range[5]);
  output[7] = iVar10;
  av1_range_check_buf(5,input,output,8,stage_range[5]);
  step._0_8_ = *(undefined8 *)output;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1e0);
  lVar14 = (long)output[2] * (long)iVar1 + lVar13;
  step[2] = (int32_t)(output[3] * iVar1 + lVar14 >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(output[3] * -iVar1 + lVar14 >> (cos_bit & 0x3fU));
  step._16_8_ = *(undefined8 *)(output + 4);
  lVar13 = (long)output[6] * (long)iVar1 + lVar13;
  step[6] = (int32_t)(output[7] * iVar1 + lVar13 >> (cos_bit & 0x3fU));
  step[7] = (int32_t)(-iVar1 * output[7] + lVar13 >> (cos_bit & 0x3fU));
  av1_range_check_buf(6,input,step,8,stage_range[6]);
  *output = step[0];
  output[1] = -step[4];
  output[2] = step[6];
  output[3] = -step[2];
  output[4] = step[3];
  output[5] = -step[7];
  output[6] = step[5];
  output[7] = -step[1];
  return;
}

Assistant:

void av1_iadst8(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 8;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[7];
  bf1[1] = input[0];
  bf1[2] = input[5];
  bf1[3] = input[2];
  bf1[4] = input[3];
  bf1[5] = input[4];
  bf1[6] = input[1];
  bf1[7] = input[6];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[4], bf0[0], cospi[60], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[60], bf0[0], -cospi[4], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[20], bf0[2], cospi[44], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[44], bf0[2], -cospi[20], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[36], bf0[4], cospi[28], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[28], bf0[4], -cospi[36], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[52], bf0[6], cospi[12], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[12], bf0[6], -cospi[52], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[4], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[5], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[6], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[7], stage_range[stage]);
  bf1[4] = clamp_value(bf0[0] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[1] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[2] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[3] - bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[2], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[3], stage_range[stage]);
  bf1[2] = clamp_value(bf0[0] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[1] - bf0[3], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[6], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[7], stage_range[stage]);
  bf1[6] = clamp_value(bf0[4] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[5] - bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = -bf0[4];
  bf1[2] = bf0[6];
  bf1[3] = -bf0[2];
  bf1[4] = bf0[3];
  bf1[5] = -bf0[7];
  bf1[6] = bf0[5];
  bf1[7] = -bf0[1];
}